

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_init_warp_params
               (InterPredParams *inter_pred_params,WarpTypesAllowed *warp_types,int ref,
               MACROBLOCKD *xd,MB_MODE_INFO *mi)

{
  WarpedMotionParams *pWVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int8_t iVar6;
  undefined2 uVar7;
  int16_t iVar8;
  int16_t iVar9;
  int16_t iVar10;
  int16_t iVar11;
  WarpedMotionParams *pWVar12;
  bool bVar13;
  
  if (inter_pred_params->block_height < 8) {
    return;
  }
  if (inter_pred_params->block_width < 8) {
    return;
  }
  if (xd->cur_frame_force_integer_mv != 0) {
    return;
  }
  pWVar12 = xd->global_motion + mi->ref_frame[ref];
  iVar2 = inter_pred_params->scale_factors->x_scale_fp;
  if (((iVar2 == -1) || (iVar3 = inter_pred_params->scale_factors->y_scale_fp, iVar3 == -1)) ||
     (iVar3 == 0x4000 && iVar2 == 0x4000)) {
    pWVar1 = &inter_pred_params->warp_params;
    (inter_pred_params->warp_params).wmmat[4] = 0;
    (inter_pred_params->warp_params).wmmat[5] = 0x10000;
    (inter_pred_params->warp_params).alpha = 0;
    (inter_pred_params->warp_params).beta = 0;
    (inter_pred_params->warp_params).gamma = 0;
    (inter_pred_params->warp_params).delta = 0;
    pWVar1->wmmat[0] = 0;
    pWVar1->wmmat[1] = 0;
    (inter_pred_params->warp_params).wmmat[2] = 0x10000;
    (inter_pred_params->warp_params).wmmat[3] = 0;
    (inter_pred_params->warp_params).wmtype = '\0';
    (inter_pred_params->warp_params).invalid = '\0';
    *(undefined2 *)&(inter_pred_params->warp_params).field_0x22 = 0;
    if ((warp_types->local_warp_allowed == 0) || ((mi->wm_params).invalid != '\0')) {
      if (warp_types->global_warp_allowed == 0) goto LAB_0039fafb;
      bVar13 = pWVar12->invalid == '\0';
      if (!bVar13) goto LAB_0039fb1f;
    }
    else {
      pWVar12 = &mi->wm_params;
    }
    iVar6 = pWVar12->invalid;
    uVar7 = *(undefined2 *)&pWVar12->field_0x22;
    (inter_pred_params->warp_params).wmtype = pWVar12->wmtype;
    (inter_pred_params->warp_params).invalid = iVar6;
    *(undefined2 *)&(inter_pred_params->warp_params).field_0x22 = uVar7;
    uVar4 = *(undefined8 *)pWVar12->wmmat;
    uVar5 = *(undefined8 *)(pWVar12->wmmat + 2);
    iVar8 = pWVar12->alpha;
    iVar9 = pWVar12->beta;
    iVar10 = pWVar12->gamma;
    iVar11 = pWVar12->delta;
    *(undefined8 *)((inter_pred_params->warp_params).wmmat + 4) =
         *(undefined8 *)(pWVar12->wmmat + 4);
    (inter_pred_params->warp_params).alpha = iVar8;
    (inter_pred_params->warp_params).beta = iVar9;
    (inter_pred_params->warp_params).gamma = iVar10;
    (inter_pred_params->warp_params).delta = iVar11;
    *(undefined8 *)pWVar1->wmmat = uVar4;
    *(undefined8 *)((inter_pred_params->warp_params).wmmat + 2) = uVar5;
    bVar13 = true;
  }
  else {
LAB_0039fafb:
    bVar13 = false;
  }
LAB_0039fb1f:
  if (!bVar13) {
    return;
  }
  inter_pred_params->mode = WARP_PRED;
  return;
}

Assistant:

void av1_init_warp_params(InterPredParams *inter_pred_params,
                          const WarpTypesAllowed *warp_types, int ref,
                          const MACROBLOCKD *xd, const MB_MODE_INFO *mi) {
  if (inter_pred_params->block_height < 8 || inter_pred_params->block_width < 8)
    return;

  if (xd->cur_frame_force_integer_mv) return;

  if (allow_warp(mi, warp_types, &xd->global_motion[mi->ref_frame[ref]], 0,
                 inter_pred_params->scale_factors,
                 &inter_pred_params->warp_params)) {
#if CONFIG_REALTIME_ONLY && !CONFIG_AV1_DECODER
    aom_internal_error(xd->error_info, AOM_CODEC_UNSUP_FEATURE,
                       "Warped motion is disabled in realtime only build.");
#endif  // CONFIG_REALTIME_ONLY && !CONFIG_AV1_DECODER
    inter_pred_params->mode = WARP_PRED;
  }
}